

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O3

int Bmcs_ManCollect_rec(Bmcs_Man_t *p,int iObj)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  uint uVar3;
  Gia_Obj_t *pFanout;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (iObj < 0) {
LAB_0054da81:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pGVar2 = p->pFrames;
  if ((pGVar2->vCopies).nSize <= iObj) goto LAB_0054da81;
  iVar8 = (pGVar2->vCopies).pArray[(uint)iObj];
  if (-1 < iVar8) {
    return iVar8;
  }
  if (pGVar2->nObjs <= iObj) goto LAB_0054dabf;
  if ((p->vFr2Sat).nSize <= iObj) goto LAB_0054da81;
  if ((p->vFr2Sat).pArray[(uint)iObj] < 1) {
    pGVar4 = pGVar2->pObjs + (uint)iObj;
    uVar5 = (uint)*(ulong *)pGVar4;
    if ((uVar5 & 0x9fffffff) == 0x9fffffff) goto LAB_0054d5c1;
    if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmcS.c"
                    ,0x1e5,"int Bmcs_ManCollect_rec(Bmcs_Man_t *, int)");
    }
    uVar3 = Bmcs_ManCollect_rec(p,iObj - (uVar5 & 0x1fffffff));
    uVar5 = Bmcs_ManCollect_rec(p,iObj - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
    if (((int)uVar3 < 0) || ((int)uVar5 < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar12 = *(ulong *)pGVar4;
    pGVar2 = p->pClean;
    pFanout = Gia_ManAppendObj(pGVar2);
    uVar7 = uVar3 >> 1;
    uVar1 = pGVar2->nObjs;
    if ((int)uVar1 <= (int)uVar7) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x2a2,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    uVar6 = uVar5 >> 1;
    if (uVar1 <= uVar6) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x2a3,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    if ((uVar7 == uVar6) && (pGVar2->fGiaSimple == 0)) {
      __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x2a4,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    uVar3 = (uint)(uVar12 >> 0x1d) & 1 ^ uVar3;
    uVar5 = (uint)(uVar12 >> 0x3d) & 1 ^ uVar5;
    pGVar4 = pGVar2->pObjs;
    iVar8 = (int)pFanout;
    if (uVar3 < uVar5) {
      if (pGVar4 + uVar1 <= pFanout || pFanout < pGVar4) goto LAB_0054daa0;
      uVar12 = *(ulong *)pFanout;
      uVar9 = (ulong)((uVar3 & 1) << 0x1d |
                     ((uint)(iVar8 - (int)pGVar4) >> 2) * -0x55555555 - uVar7 & 0x1fffffff);
      *(ulong *)pFanout = uVar9 | uVar12 & 0xffffffffc0000000;
      pGVar4 = pGVar2->pObjs;
      if ((pFanout < pGVar4) || (pGVar4 + pGVar2->nObjs <= pFanout)) goto LAB_0054daa0;
      uVar12 = (ulong)(uVar5 & 1) << 0x3d |
               uVar9 | uVar12 & 0xc0000000c0000000 |
               (ulong)(((uint)(iVar8 - (int)pGVar4) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) <<
               0x20;
    }
    else {
      if (pGVar4 + uVar1 <= pFanout || pFanout < pGVar4) goto LAB_0054daa0;
      uVar12 = *(ulong *)pFanout;
      uVar10 = (ulong)(((uint)(iVar8 - (int)pGVar4) >> 2) * -0x55555555 - uVar7 & 0x1fffffff) <<
               0x20;
      uVar9 = (ulong)(uVar3 & 1) << 0x3d;
      *(ulong *)pFanout = uVar9 | uVar12 & 0xc0000000ffffffff | uVar10;
      pGVar4 = pGVar2->pObjs;
      if ((pFanout < pGVar4) || (pGVar4 + pGVar2->nObjs <= pFanout)) goto LAB_0054daa0;
      uVar12 = (ulong)((uVar5 & 1) << 0x1d) | uVar9 | uVar12 & 0xc0000000c0000000 | uVar10 |
               (ulong)(((uint)(iVar8 - (int)pGVar4) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
    }
    *(ulong *)pFanout = uVar12;
    if (pGVar2->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pGVar2,pFanout + -(uVar12 & 0x1fffffff),pFanout);
      Gia_ObjAddFanout(pGVar2,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout)
      ;
    }
    if (pGVar2->fSweeper != 0) {
      uVar9 = *(ulong *)pFanout & 0x1fffffff;
      uVar12 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
      uVar10 = 0x4000000000000000;
      uVar11 = 0x4000000000000000;
      if (((uint)*(ulong *)(pFanout + -uVar9) >> 0x1e & 1) == 0) {
        uVar11 = 0x40000000;
      }
      *(ulong *)(pFanout + -uVar9) = uVar11 | *(ulong *)(pFanout + -uVar9);
      uVar11 = *(ulong *)(pFanout + -uVar12);
      if (((uint)uVar11 >> 0x1e & 1) == 0) {
        uVar10 = 0x40000000;
      }
      *(ulong *)(pFanout + -uVar12) = uVar10 | uVar11;
      uVar12 = *(ulong *)pFanout;
      *(ulong *)pFanout =
           uVar12 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar12 >> 0x3d) ^ (uint)(uVar11 >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pFanout + -uVar9) >> 0x3f) ^
                  (uint)(uVar12 >> 0x1d) & 7)) << 0x3f;
    }
    if (pGVar2->fBuiltInSim != 0) {
      uVar12 = *(ulong *)pFanout;
      *(ulong *)pFanout =
           uVar12 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar12 >> 0x3d) ^
                   (uint)((ulong)*(undefined8 *)(pFanout + -(uVar12 >> 0x20 & 0x1fffffff)) >> 0x3f))
                  & ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar12 & 0x1fffffff)) >> 0x3f) ^
                    (uint)(uVar12 >> 0x1d) & 7)) << 0x3f;
      pGVar4 = pGVar2->pObjs;
      if ((pFanout < pGVar4) || (pGVar4 + pGVar2->nObjs <= pFanout)) goto LAB_0054daa0;
      Gia_ManBuiltInSimPerform
                (pGVar2,(int)((ulong)((long)pFanout - (long)pGVar4) >> 2) * -0x55555555);
    }
    if (pGVar2->vSuppWords != (Vec_Wrd_t *)0x0) {
      Gia_ManQuantSetSuppAnd(pGVar2,pFanout);
    }
    pGVar4 = pGVar2->pObjs;
    if (pFanout < pGVar4) goto LAB_0054daa0;
    iVar8 = pGVar2->nObjs;
  }
  else {
LAB_0054d5c1:
    pGVar2 = p->pClean;
    pFanout = Gia_ManAppendObj(pGVar2);
    uVar12 = *(ulong *)pFanout;
    *(ulong *)pFanout = uVar12 | 0x9fffffff;
    *(ulong *)pFanout =
         uVar12 & 0xe0000000ffffffff | 0x9fffffff |
         (ulong)(pGVar2->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar4 = pGVar2->pObjs;
    if ((pFanout < pGVar4) || (pGVar4 + pGVar2->nObjs <= pFanout)) goto LAB_0054daa0;
    Vec_IntPush(pGVar2->vCis,(int)((ulong)((long)pFanout - (long)pGVar4) >> 2) * -0x55555555);
    pGVar4 = pGVar2->pObjs;
    if (pFanout < pGVar4) goto LAB_0054daa0;
    iVar8 = pGVar2->nObjs;
  }
  if (pFanout < pGVar4 + iVar8) {
    iVar8 = (int)((long)pFanout - (long)pGVar4 >> 2);
    uVar5 = iVar8 * -0x55555555;
    iVar8 = iVar8 * 0x55555556;
    if (iVar8 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((int)(uVar5 & 0x7fffffff) < p->pClean->nObjs) {
      p->pClean->pObjs[uVar5 & 0x7fffffff].Value = iObj;
      if (iObj < (p->pFrames->vCopies).nSize) {
        (p->pFrames->vCopies).pArray[(uint)iObj] = iVar8;
        return iVar8;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
LAB_0054dabf:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0054daa0:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Bmcs_ManCollect_rec( Bmcs_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj; 
    int iSatVar, iLitClean = Gia_ObjCopyArray( p->pFrames, iObj );
    if ( iLitClean >= 0 )
        return iLitClean;
    pObj = Gia_ManObj( p->pFrames, iObj );
    iSatVar = Vec_IntEntry( &p->vFr2Sat, iObj );
    if ( iSatVar > 0 || Gia_ObjIsCi(pObj) )
        iLitClean = Gia_ManAppendCi( p->pClean );
    else if ( Gia_ObjIsAnd(pObj) )
    {
        int iLit0 = Bmcs_ManCollect_rec( p, Gia_ObjFaninId0(pObj, iObj) );
        int iLit1 = Bmcs_ManCollect_rec( p, Gia_ObjFaninId1(pObj, iObj) );
        iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
        iLitClean = Gia_ManAppendAnd( p->pClean, iLit0, iLit1 );
    }
    else assert( 0 );
    assert( !Abc_LitIsCompl(iLitClean) );
    Gia_ManObj( p->pClean, Abc_Lit2Var(iLitClean) )->Value = iObj;
    Gia_ObjSetCopyArray( p->pFrames, iObj, iLitClean );
    return iLitClean;
}